

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O0

void __thiscall cornerstone::raft_server::handle_voting_resp(raft_server *this,resp_msg *resp)

{
  bool bVar1;
  int32 iVar2;
  ulong uVar3;
  element_type *peVar4;
  ulong uVar5;
  element_type *peVar6;
  char *__s;
  _Node_iterator_base<int,_false> __a;
  size_type sVar7;
  size_type sVar8;
  resp_msg *in_RSI;
  long in_RDI;
  pair<std::__detail::_Node_iterator<int,_true,_false>,_bool> pVar9;
  shared_lock<std::shared_timed_mutex> rlock;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  *in_stack_fffffffffffffce8;
  strfmt<100> *in_stack_fffffffffffffcf0;
  value_type *in_stack_fffffffffffffcf8;
  int iVar10;
  strfmt<100> *in_stack_fffffffffffffd00;
  allocator<char> *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  allocator<char> local_249 [25];
  raft_server *in_stack_fffffffffffffdd0;
  string local_1d8 [32];
  _Node_iterator_base<int,_false> local_1b8;
  undefined1 local_1b0;
  int32 local_1a4;
  allocator<char> local_189;
  strfmt<100> local_188;
  string local_118 [32];
  _Node_iterator_base<int,_false> local_f8;
  int32 local_ec;
  _Node_iterator_base<int,_false> local_e8;
  allocator<char> local_d9;
  string local_d8 [55];
  allocator<char> local_a1;
  strfmt<100> local_a0;
  string local_30 [32];
  resp_msg *local_10;
  
  local_10 = in_RSI;
  uVar3 = msg_base::get_term(&in_RSI->super_msg_base);
  peVar4 = std::
           __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1de670);
  uVar5 = srv_state::get_term(peVar4);
  if (uVar3 == uVar5) {
    if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
      local_ec = msg_base::get_src(&local_10->super_msg_base);
      local_e8._M_cur =
           (__node_type *)
           std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::find
                     (in_stack_fffffffffffffce8,(key_type *)0x1de8e9);
      local_f8._M_cur =
           (__node_type *)
           std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                     (in_stack_fffffffffffffce8);
      bVar1 = std::__detail::operator!=(&local_e8,&local_f8);
      if (bVar1) {
        peVar6 = std::
                 __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1de93f);
        iVar10 = (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
        strfmt<100>::strfmt(&local_188,"Duplicate vote from %d for term %lld");
        msg_base::get_src(&local_10->super_msg_base);
        peVar4 = std::
                 __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1de982);
        srv_state::get_term(peVar4);
        strfmt<100>::fmt<int,unsigned_long>
                  (in_stack_fffffffffffffd00,iVar10,(unsigned_long)in_stack_fffffffffffffcf0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
        (*peVar6->_vptr_logger[3])(peVar6,local_118);
        std::__cxx11::string::~string(local_118);
        std::allocator<char>::~allocator(&local_189);
      }
      else {
        std::shared_lock<std::shared_timed_mutex>::shared_lock
                  ((shared_lock<std::shared_timed_mutex> *)in_stack_fffffffffffffcf0,
                   (mutex_type *)in_stack_fffffffffffffce8);
        __s = (char *)(in_RDI + 0x310);
        iVar2 = msg_base::get_src(&local_10->super_msg_base);
        local_1a4 = iVar2;
        pVar9 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
                insert((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        __a._M_cur = (__node_type *)pVar9.first.super__Node_iterator_base<int,_false>._M_cur;
        local_1b0 = pVar9.second;
        local_1b8._M_cur = __a._M_cur;
        bVar1 = resp_msg::get_accepted(local_10);
        if (bVar1) {
          *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + 1;
        }
        sVar7 = std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
                size((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *
                     )0x1deb2a);
        sVar8 = std::
                unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                ::size((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                        *)0x1deb43);
        if (sVar8 + 1 <= sVar7) {
          *(undefined1 *)(in_RDI + 0x28) = 1;
        }
        iVar10 = *(int *)(in_RDI + 0x10);
        sVar8 = std::
                unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                ::size((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                        *)0x1deb7b);
        if ((int)(sVar8 + 1 >> 1) < iVar10) {
          peVar6 = std::
                   __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1deba5);
          strfmt<100>::strfmt((strfmt<100> *)(local_249 + 1),
                              "Server is elected as leader for term %llu");
          peVar4 = std::
                   __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1debd4);
          srv_state::get_term(peVar4);
          in_stack_fffffffffffffcf0 =
               (strfmt<100> *)
               strfmt<100>::fmt<unsigned_long>
                         (in_stack_fffffffffffffcf0,(unsigned_long)in_stack_fffffffffffffce8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(iVar2,in_stack_fffffffffffffd30),__s,(allocator<char> *)__a._M_cur);
          (*peVar6->_vptr_logger[3])(peVar6,local_1d8);
          std::__cxx11::string::~string(local_1d8);
          std::allocator<char>::~allocator(local_249);
          *(undefined1 *)(in_RDI + 0x28) = 1;
          become_leader(in_stack_fffffffffffffdd0);
        }
        std::shared_lock<std::shared_timed_mutex>::~shared_lock
                  ((shared_lock<std::shared_timed_mutex> *)in_stack_fffffffffffffcf0);
      }
    }
    else {
      peVar6 = std::
               __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1de7f2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
      (*peVar6->_vptr_logger[3])(peVar6,local_d8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator(&local_d9);
    }
  }
  else {
    peVar6 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1de6a0);
    strfmt<100>::strfmt(&local_a0,
                        "Received an outdated vote response at term %llu v.s. current term %llu");
    msg_base::get_term(&local_10->super_msg_base);
    peVar4 = std::
             __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1de6ed);
    srv_state::get_term(peVar4);
    strfmt<100>::fmt<unsigned_long,unsigned_long>
              (in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8,
               (unsigned_long)in_stack_fffffffffffffcf0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    (*peVar6->_vptr_logger[3])(peVar6,local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_a1);
  }
  return;
}

Assistant:

void raft_server::handle_voting_resp(resp_msg& resp)
{
    if (resp.get_term() != state_->get_term())
    {
        l_->info(sstrfmt("Received an outdated vote response at term %llu v.s. current term %llu")
                     .fmt(resp.get_term(), state_->get_term()));
        return;
    }

    if (election_completed_)
    {
        l_->info("Election completed, will ignore the voting result from this server");
        return;
    }

    if (voted_servers_.find(resp.get_src()) != voted_servers_.end())
    {
        l_->info(sstrfmt("Duplicate vote from %d for term %lld").fmt(resp.get_src(), state_->get_term()));
        return;
    }

    {
        read_lock(peers_lock_);
        voted_servers_.insert(resp.get_src());
        if (resp.get_accepted())
        {
            votes_granted_ += 1;
        }

        if (voted_servers_.size() >= (peers_.size() + 1))
        {
            election_completed_ = true;
        }

        if (votes_granted_ > (int32)((peers_.size() + 1) / 2))
        {
            l_->info(sstrfmt("Server is elected as leader for term %llu").fmt(state_->get_term()));
            election_completed_ = true;
            become_leader();
        }
    }
}